

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmGlobalGenerator.cxx
# Opt level: O0

void __thiscall
cmGlobalGenerator::PrintCompilerAdvice
          (cmGlobalGenerator *this,ostream *os,string *lang,cmValue envVar)

{
  bool bVar1;
  ostream *poVar2;
  string *lang_local;
  ostream *os_local;
  cmGlobalGenerator *this_local;
  cmValue envVar_local;
  
  this_local = (cmGlobalGenerator *)envVar.Value;
  std::operator<<(os,"Tell CMake where to find the compiler by setting ");
  bVar1 = cmValue::operator_cast_to_bool((cmValue *)&this_local);
  if (bVar1) {
    poVar2 = std::operator<<(os,"either the environment variable \"");
    poVar2 = ::operator<<(poVar2,(cmValue)this_local);
    std::operator<<(poVar2,"\" or ");
  }
  poVar2 = std::operator<<(os,"the CMake cache entry CMAKE_");
  poVar2 = std::operator<<(poVar2,(string *)lang);
  std::operator<<(poVar2,
                  "_COMPILER to the full path to the compiler, or to the compiler name if it is in the PATH."
                 );
  return;
}

Assistant:

void cmGlobalGenerator::PrintCompilerAdvice(std::ostream& os,
                                            std::string const& lang,
                                            cmValue envVar) const
{
  // Subclasses override this method if they do not support this advice.
  os << "Tell CMake where to find the compiler by setting ";
  if (envVar) {
    os << "either the environment variable \"" << envVar << "\" or ";
  }
  os << "the CMake cache entry CMAKE_" << lang
     << "_COMPILER "
        "to the full path to the compiler, or to the compiler name "
        "if it is in the PATH.";
}